

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O2

void multest(int base,int test)

{
  long lVar1;
  clock_t cVar2;
  clock_t cVar3;
  clock_t cVar4;
  clock_t cVar5;
  clock_t cVar6;
  int iVar7;
  pointer pBVar8;
  undefined4 in_register_0000003c;
  pointer pBVar9;
  bool bVar10;
  float fVar11;
  vector<BN,_std::allocator<BN>_> v1;
  vector<BN,_std::allocator<BN>_> v2;
  vector<BN,_std::allocator<BN>_> local_d8;
  long local_b8;
  undefined8 local_b0;
  vector<BN,_std::allocator<BN>_> local_a8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  local_b0 = CONCAT44(in_register_0000003c,base);
  local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (BN *)0x0;
  local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar7 = 0;
  if (0 < test) {
    iVar7 = test;
  }
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    BN::makeRandom((BN *)&local_90,(long)base);
    std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_d8,(BN *)&local_90);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_90);
    BN::makeRandom((BN *)&local_90,(long)base);
    std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_a8,(BN *)&local_90);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_90);
  }
  cVar2 = clock();
  pBVar8 = local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (pBVar9 = local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_start;
      pBVar9 != local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_finish; pBVar9 = pBVar9 + 1) {
    BN::classicMultiplication((BN *)&local_48,pBVar9,pBVar8);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
    pBVar8 = pBVar8 + 1;
  }
  cVar3 = clock();
  cVar4 = clock();
  pBVar8 = local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (pBVar9 = local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_start;
      pBVar9 != local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_finish; pBVar9 = pBVar9 + 1) {
    BN::fastMultiplication((BN *)&local_60,pBVar9,pBVar8);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
    pBVar8 = pBVar8 + 1;
  }
  cVar5 = clock();
  local_b8 = clock();
  pBVar8 = local_a8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (pBVar9 = local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_start; lVar1 = local_b8,
      pBVar9 != local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
                ._M_finish; pBVar9 = pBVar9 + 1) {
    BN::karatsubaMultiplication((BN *)&local_78,pBVar9,pBVar8);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_78);
    pBVar8 = pBVar8 + 1;
  }
  cVar6 = clock();
  fVar11 = (float)test;
  printf("%d\t%d\t%d\t%.2f\t\t%.2f\t\t%.2f\n",
         SUB84((double)((float)(ulong)(cVar3 - cVar2) / fVar11),0),
         (double)((float)(ulong)(cVar5 - cVar4) / fVar11),
         (double)((float)(ulong)(cVar6 - lVar1) / fVar11),local_b0,(ulong)(uint)((int)local_b0 * 8),
         (ulong)(uint)test);
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_a8);
  std::vector<BN,_std::allocator<BN>_>::~vector(&local_d8);
  return;
}

Assistant:

void multest(int base,int test)
{
        uint64_t t;
        vector <BN> v1;
        vector <BN> v2;

        for(int i=0;i<test;i++) {
                v1.push_back(BN::makeRandom(base));
                v2.push_back(BN::makeRandom(base));
        }

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->classicMultiplication(*j);
        float t1 = clock() - t;

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->fastMultiplication(*j);
        float t2 = clock() - t;

        t = clock();
        for(vector <BN> :: iterator i = v1.begin(), j = v2.begin(); i != v1.end(); i++, j++)
            i->karatsubaMultiplication(*j);
        float t3 = clock() - t;

        float diviser = test;
        t1 /= diviser;
        t2 /= diviser;
        t3 /= diviser;

        printf("%d\t%d\t%d\t%.2f\t\t%.2f\t\t%.2f\n",base,(int)(base*8),(int)test, t1, t2, t3);
}